

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool init::StartLogging(ArgsManager *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  Logger *pLVar6;
  int64_t nTime;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *args_00;
  _Alloc_hider _Var7;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  undefined1 local_120 [32];
  path config_file_path;
  char *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar6 = LogInstance();
  if (pLVar6->m_print_to_file == true) {
    paVar1 = &local_78.original.field_2;
    local_78.original._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-shrinkdebugfile","");
    pLVar6 = LogInstance();
    bVar4 = BCLog::Logger::DefaultShrinkDebugFile(pLVar6);
    bVar4 = ArgsManager::GetBoolArg(args,&local_78.original,bVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      pLVar6 = LogInstance();
      BCLog::Logger::ShrinkDebugFile(pLVar6);
    }
  }
  pLVar6 = LogInstance();
  bVar4 = BCLog::Logger::StartLogging(pLVar6);
  if (!bVar4) {
    local_d8 = local_d0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Could not open debug log file %s","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_d8,local_d8 + local_d0._M_allocated_capacity);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_d8,local_d8 + local_d0._M_allocated_capacity);
    pLVar6 = LogInstance();
    pcVar3 = (pLVar6->m_file_path).super_path._M_pathname._M_dataplus._M_p;
    paVar1 = &config_file_path.super_path._M_pathname.field_2;
    config_file_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&config_file_path,pcVar3,
               pcVar3 + (pLVar6->m_file_path).super_path._M_pathname._M_string_length);
    tinyformat::format<std::__cxx11::string>
              (&local_78,(tinyformat *)&local_b8,(bilingual_str *)&config_file_path,in_RCX);
    bVar4 = InitError(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      local_78.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)config_file_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(config_file_path.super_path._M_pathname._M_dataplus._M_p,
                      config_file_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != local_d0._M_local_buf + 8) {
      operator_delete(local_d8,local_d0._8_8_ + 1);
    }
    goto LAB_006996e5;
  }
  pLVar6 = LogInstance();
  if (pLVar6->m_log_timestamps == false) {
    nTime = GetTime();
    FormatISO8601DateTime_abi_cxx11_(&local_78.original,nTime);
    logging_function._M_str = "StartLogging";
    logging_function._M_len = 0xc;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
    ;
    source_file._M_len = 0x5f;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x77,ALL,Info,(ConstevalFormatString<1U>)0x8667aa,
               &local_78.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
    }
  }
  GetDefaultDataDir();
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,local_78.original._M_dataplus._M_p,
             local_78.original._M_dataplus._M_p + local_78.original._M_string_length);
  logging_function_00._M_str = "StartLogging";
  logging_function_00._M_len = 0xc;
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
  ;
  source_file_00._M_len = 0x5f;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_00,source_file_00,0x78,ALL,Info,(ConstevalFormatString<1U>)0x8667bc,
             &local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&local_78);
  ArgsManager::GetDataDir((path *)&local_78,&gArgs,true);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,local_78.original._M_dataplus._M_p,
             local_78.original._M_dataplus._M_p + local_78.original._M_string_length);
  logging_function_01._M_str = "StartLogging";
  logging_function_01._M_len = 0xc;
  source_file_01._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
  ;
  source_file_01._M_len = 0x5f;
  args_00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp";
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_01,source_file_01,0x79,ALL,Info,(ConstevalFormatString<1U>)0x8667d7,
             &local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&local_78);
  ArgsManager::GetConfigFilePath(&config_file_path,args);
  cVar5 = std::filesystem::status((path *)&config_file_path);
  if ((cVar5 == '\0') || (cVar5 == -1)) {
    paVar2 = &local_78.original.field_2;
    local_78.original._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-conf","");
    bVar4 = ArgsManager::IsArgSet(args,&local_78.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      local_78.original._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,config_file_path.super_path._M_pathname._M_dataplus._M_p,
                 config_file_path.super_path._M_pathname._M_dataplus._M_p +
                 config_file_path.super_path._M_pathname._M_string_length);
      logging_function_03._M_str = "StartLogging";
      logging_function_03._M_len = 0xc;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
      ;
      source_file_03._M_len = 0x5f;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_03,source_file_03,0x84,ALL,Info,
                 (ConstevalFormatString<1U>)0x86682d,&local_78.original);
      goto LAB_006995c0;
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"The specified config file %s does not exist","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"The specified config file %s does not exist","");
    }
    else {
      local_120._0_8_ = "The specified config file %s does not exist";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_98,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_120);
    }
    local_120._0_8_ = local_120 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,config_file_path.super_path._M_pathname._M_dataplus._M_p,
               config_file_path.super_path._M_pathname._M_dataplus._M_p +
               config_file_path.super_path._M_pathname._M_string_length);
    tinyformat::format<std::__cxx11::string>
              (&local_78,(tinyformat *)&local_b8,(bilingual_str *)local_120,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00);
    InitWarning(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      local_78.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      local_78.original.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_78.original.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    _Var7._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) goto LAB_006996c9;
  }
  else {
    local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,config_file_path.super_path._M_pathname._M_dataplus._M_p,
               config_file_path.super_path._M_pathname._M_dataplus._M_p +
               config_file_path.super_path._M_pathname._M_string_length);
    logging_function_02._M_str = "StartLogging";
    logging_function_02._M_len = 0xc;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
    ;
    source_file_02._M_len = 0x5f;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_02,source_file_02,0x7e,ALL,Info,(ConstevalFormatString<1U>)0x8667f0,
               &local_78.original);
LAB_006995c0:
    _Var7._M_p = local_78.original._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
LAB_006996c9:
      operator_delete(_Var7._M_p,local_78.original.field_2._M_allocated_capacity + 1);
    }
  }
  ArgsManager::LogArgs(args);
  std::filesystem::__cxx11::path::~path(&config_file_path.super_path);
  bVar4 = true;
LAB_006996e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool StartLogging(const ArgsManager& args)
{
    if (LogInstance().m_print_to_file) {
        if (args.GetBoolArg("-shrinkdebugfile", LogInstance().DefaultShrinkDebugFile())) {
            // Do this first since it both loads a bunch of debug.log into memory,
            // and because this needs to happen before any other debug.log printing
            LogInstance().ShrinkDebugFile();
        }
    }
    if (!LogInstance().StartLogging()) {
            return InitError(strprintf(Untranslated("Could not open debug log file %s"),
                fs::PathToString(LogInstance().m_file_path)));
    }

    if (!LogInstance().m_log_timestamps)
        LogPrintf("Startup time: %s\n", FormatISO8601DateTime(GetTime()));
    LogPrintf("Default data directory %s\n", fs::PathToString(GetDefaultDataDir()));
    LogPrintf("Using data directory %s\n", fs::PathToString(gArgs.GetDataDirNet()));

    // Only log conf file usage message if conf file actually exists.
    fs::path config_file_path = args.GetConfigFilePath();
    if (fs::exists(config_file_path)) {
        LogPrintf("Config file: %s\n", fs::PathToString(config_file_path));
    } else if (args.IsArgSet("-conf")) {
        // Warn if no conf file exists at path provided by user
        InitWarning(strprintf(_("The specified config file %s does not exist"), fs::PathToString(config_file_path)));
    } else {
        // Not categorizing as "Warning" because it's the default behavior
        LogPrintf("Config file: %s (not found, skipping)\n", fs::PathToString(config_file_path));
    }

    // Log the config arguments to debug.log
    args.LogArgs();

    return true;
}